

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::IntOption::printOptions(IntOption *this,FILE *pcsFile,int granularity)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  char *__format;
  ulong uVar6;
  vector<int,_std::allocator<int>_> values;
  char *pcVar7;
  vector<int,_std::allocator<int>_> local_48;
  
  pcVar4 = strstr((this->super_Option).name,"debug");
  if (((pcVar4 == (char *)0x0) &&
      (pcVar4 = strstr((this->super_Option).description,"debug"), pcVar4 == (char *)0x0)) &&
     (iVar3 = (*(this->super_Option)._vptr_Option[10])(this), (char)iVar3 != '\0')) {
    if (granularity == 0) {
      uVar5 = (this->range).begin;
      uVar1 = (this->range).end;
      if ((uVar1 == 0x7fffffff || uVar5 - uVar1 < 0xfffffff0) && ((int)uVar1 < 0 || 0 < (int)uVar5))
      {
        uVar2 = this->value;
        pcVar4 = (this->super_Option).name;
        pcVar7 = (this->super_Option).description;
        __format = "%s  [%d,%d] [%d]il   # %s\n";
      }
      else {
        pcVar4 = (this->super_Option).name;
        if (0xffffffef < uVar5 - uVar1) {
          fprintf((FILE *)pcsFile,"%s  {%d",pcVar4);
          uVar5 = (this->range).begin;
          if ((int)uVar5 < (this->range).end) {
            do {
              uVar5 = uVar5 + 1;
              fprintf((FILE *)pcsFile,",%d",(ulong)uVar5);
            } while ((int)uVar5 < (this->range).end);
          }
          fprintf((FILE *)pcsFile,"} [%d]    # %s\n",(ulong)(uint)this->value,
                  (this->super_Option).description);
          return;
        }
        uVar2 = this->value;
        pcVar7 = (this->super_Option).description;
        __format = "%s  [%d,%d] [%d]i    # %s\n";
      }
      fprintf((FILE *)pcsFile,__format,pcVar4,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,pcVar7);
    }
    else {
      fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      fillGranularityDomain(this,granularity,&local_48);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar6 = 0;
        do {
          if (uVar6 != 0) {
            fputc(0x2c,(FILE *)pcsFile);
          }
          fprintf((FILE *)pcsFile,"%d",
                  (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      fprintf((FILE *)pcsFile,"} [%d]    # %s\n",(ulong)(uint)this->value,
              (this->super_Option).description);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        if (granularity != 0) {
            fprintf(pcsFile, "%s  {", name);
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (i != 0) {
                    fprintf(pcsFile, ",");
                }
                fprintf(pcsFile, "%d", values[i]);
            }
            fprintf(pcsFile, "} [%d]    # %s\n", value, description);
        } else {
            if ((range.end - range.begin <= 16 && range.end - range.begin > 0 && range.end != INT32_MAX) ||
                (range.begin <= 0 && range.end >= 0)) {
                if (range.end - range.begin <= 16 && range.end - range.begin > 0) { // print all values if the difference is really small
                    fprintf(pcsFile, "%s  {%d", name, range.begin);
                    for (int i = range.begin + 1; i <= range.end; ++i) {
                        fprintf(pcsFile, ",%d", i);
                    }
                    fprintf(pcsFile, "} [%d]    # %s\n", value, description);
                } else {
                    fprintf(pcsFile, "%s  [%d,%d] [%d]i    # %s\n", name, range.begin, range.end, value, description);
                }
            } else {
                fprintf(pcsFile, "%s  [%d,%d] [%d]il   # %s\n", name, range.begin, range.end, value, description);
            }
        }
    }